

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O0

void __thiscall
mocker::detail::RegisterAllocator::allocate::anon_class_8_1_8991fb9c::operator()
          (anon_class_8_1_8991fb9c *this,Node *n)

{
  RegisterAllocator *pRVar1;
  bool bVar2;
  reference mov_00;
  shared_ptr<mocker::nasm::Mov> *mov;
  iterator __end3;
  iterator __begin3;
  vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
  *__range3;
  vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
  movs;
  Node *n_local;
  anon_class_8_1_8991fb9c *this_local;
  
  pRVar1 = this->this;
  movs.
  super__Vector_base<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)n;
  MoveInfo::getCurAssociatedMoves
            ((vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
              *)&__range3,&pRVar1->moveInfo,n);
  __end3 = std::
           vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
           ::begin((vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
                    *)&__range3);
  mov = (shared_ptr<mocker::nasm::Mov> *)
        std::
        vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
        ::end((vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
               *)&__range3);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<std::shared_ptr<mocker::nasm::Mov>_*,_std::vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>
                                *)&mov);
    if (!bVar2) break;
    mov_00 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<mocker::nasm::Mov>_*,_std::vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>
             ::operator*(&__end3);
    MoveInfo::enableMove(&pRVar1->moveInfo,mov_00);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<mocker::nasm::Mov>_*,_std::vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>
    ::operator++(&__end3);
  }
  std::
  vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>::
  ~vector((vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
           *)&__range3);
  return;
}

Assistant:

void RegisterAllocator::allocate() {
  auto enableMoves = [this](const Node &n) {
    auto movs = moveInfo.getCurAssociatedMoves(n);
    for (auto &mov : movs)
      moveInfo.enableMove(mov);
  };
  auto isMoveRelated = [this](const Node &n) {
    return moveInfo.isMoveRelated(n);
  };
  auto freezeMoves = [this](const Node &n) { return moveInfo.freezeMoves(n); };

  while (true) {
    auto nonPrecolored = getNonPrecoloredNodes(funcBeg, funcEnd);
    interG.clearAndInit(nonPrecolored);
    interG.bindFunctions(enableMoves, isMoveRelated, freezeMoves);
    moveInfo.clearAndInit(nonPrecolored);

    interG.build(
        funcBeg, funcEnd,
        [this](const MovInst &mov) { moveInfo.pushWorklist(mov); },
        [this](const MovInst &mov) { moveInfo.updateAssociatedMoves(mov); });
    interG.initWorklists(nonPrecolored);

    while (true) {
      if (interG.simplify())
        continue;
      if (coalesce())
        continue;
      if (interG.freezeNode())
        continue;
      if (interG.spill())
        continue;
      break;
    }

    std::vector<Node> toBeSpilled;
    RegMap<Node> coloring;
    std::tie(toBeSpilled, coloring) = interG.assignColors();
    if (toBeSpilled.empty()) {
      color(coloring);
      break;
    }
    spilledLastTime = RegSet(toBeSpilled.begin(), toBeSpilled.end());
    std::cerr << "\nto be spilled: ";
    for (auto &reg : toBeSpilled)
      std::cerr << reg->getIdentifier() << ", ";
    std::cerr << std::endl;
    rewriteProgram(toBeSpilled);
  }
}